

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_url_session.hpp
# Opt level: O1

void __thiscall
m2d::savanna::
async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_get_yahoo_endpoint>
::on_read(async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_get_yahoo_endpoint>
          *this,error_code ec,size_t bytes_transferred)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  element_type *peVar3;
  node_ptr plVar4;
  char cVar5;
  int iVar6;
  undefined8 uVar7;
  error_category *peVar8;
  ulong uVar9;
  system_error *this_00;
  _Alloc_hider _Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  bool bVar12;
  string_view name;
  string_view sVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> location;
  url new_url;
  undefined8 local_688;
  error_category *peStack_680;
  undefined1 *local_678;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_670;
  undefined1 local_668 [16];
  url local_658;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  ulong local_4d8;
  error_category *peStack_4d0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  _Tuple_impl<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
  local_440;
  undefined **local_438 [2];
  ulong local_428;
  error_category *peStack_420;
  _Alloc_hider local_418;
  size_type local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  undefined **local_3f8 [2];
  ulong local_3e8;
  error_category *local_3e0;
  _Alloc_hider local_3d8;
  size_type local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  local_3b8;
  message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  local_2c0;
  result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  local_218;
  result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  local_120;
  
  peVar8 = ec.cat_;
  uVar9 = ec._0_8_;
  local_688._4_1_ = ec.failed_;
  local_688 = uVar9;
  peStack_680 = peVar8;
  if ((bool)local_688._4_1_ == true) {
    std::runtime_error::runtime_error((runtime_error *)local_3f8,"");
    local_3f8[0] = &PTR__system_error_0026e108;
    local_3d8._M_p = (pointer)&local_3c8;
    local_3d0 = 0;
    local_3c8._M_local_buf[0] = '\0';
    local_3e8 = uVar9;
    local_3e0 = peVar8;
    result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
    ::result(&local_120,(system_error *)local_3f8);
    if ((this->completion_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
LAB_0017eba5:
      __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                    "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::beast::basic_stream<boost::asio::ip::tcp>::impl_type>::operator->() const [T = boost::beast::basic_stream<boost::asio::ip::tcp>::impl_type]"
                   );
    }
    (*(this->completion_)._M_invoker)((_Any_data *)&this->completion_,&local_120);
    if (local_120.error.super_type.m_initialized == true) {
      boost::system::system_error::~system_error
                ((system_error *)&local_120.error.super_type.m_storage);
      local_120.error.super_type.m_initialized = false;
    }
    boost::optional_detail::
    optional_base<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
    ::~optional_base((optional_base<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
                      *)&local_120);
    this_00 = (system_error *)local_3f8;
LAB_0017e4f4:
    boost::system::system_error::~system_error(this_00);
  }
  else {
    async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>
    ::current_scheme_abi_cxx11_(&local_658.scheme_,this);
    if ((long *)local_658.scheme_._M_string_length == DAT_00272a38) {
      if ((long *)local_658.scheme_._M_string_length == (long *)0x0) {
        bVar12 = true;
      }
      else {
        iVar6 = bcmp(local_658.scheme_._M_dataplus._M_p,url_scheme::https_abi_cxx11_,
                     local_658.scheme_._M_string_length);
        bVar12 = iVar6 == 0;
      }
    }
    else {
      bVar12 = false;
    }
    paVar1 = &local_658.scheme_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_658.scheme_._M_dataplus._M_p != paVar1) {
      operator_delete(local_658.scheme_._M_dataplus._M_p);
    }
    if (bVar12) {
      boost::beast::
      basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
      ::expires_after((basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
                       *)(((this->ssl_stream_).
                           super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->p_)._M_t.
                         super___uniq_ptr_impl<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
                      ,(duration)(this->original_request_).timeout_interval.__r);
      if ((99 < (this->response_).
                super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
                result_ - multiple_choices) || ((this->original_request_).follow_location != true))
      {
        peVar2 = (this->ssl_stream_).
                 super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        std::
        __shared_ptr<m2d::savanna::async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>,(__gnu_cxx::_Lock_policy)2>
        ::
        __shared_ptr<m2d::savanna::async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>,void>
                  ((__shared_ptr<m2d::savanna::async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,get_yahoo_endpoint>,(__gnu_cxx::_Lock_policy)2>
                    *)&local_678,
                   (__weak_ptr<m2d::savanna::async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_get_yahoo_endpoint>,_(__gnu_cxx::_Lock_policy)2>
                    *)this);
        local_658.scheme_._M_dataplus._M_p = (pointer)on_shutdown;
        local_658.scheme_._M_string_length = 0;
        local_658.scheme_.field_2._M_allocated_capacity = (size_type)local_678;
        local_658.scheme_.field_2._8_8_ = p_Stack_670;
        local_678 = (undefined1 *)0x0;
        p_Stack_670 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_440.
        super__Head_base<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_false>
        ._M_head_impl =
             (peVar2->p_)._M_t.
             super___uniq_ptr_impl<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_std::default_delete<boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_>_>
             .
             super__Head_base<0UL,_boost::beast::flat_stream<boost::asio::ssl::stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>_>_*,_false>
        ;
        boost::asio::ssl::
        stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>
        ::initiate_async_shutdown::operator()
                  ((initiate_async_shutdown *)&local_440,
                   (bind_front_wrapper<void_(m2d::savanna::async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_get_yahoo_endpoint>::*)(boost::system::error_code),_std::shared_ptr<m2d::savanna::async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_get_yahoo_endpoint>_>_>
                    *)&local_658);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_658.scheme_.field_2._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_658.scheme_.field_2._8_8_
                    );
        }
        if (p_Stack_670 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_670);
        return;
      }
      name.len_ = 8;
      name.ptr_ = "Location";
      sVar13 = boost::beast::http::basic_fields<std::allocator<char>_>::operator[]
                         ((basic_fields<std::allocator<char>_> *)&this->response_,name);
      local_678 = local_668;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_678,sVar13.ptr_,sVar13.ptr_ + sVar13.len_);
      local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4f8,local_678,
                 (undefined1 *)((long)&p_Stack_670->_vptr__Sp_counted_base + (long)local_678));
      url::url(&local_658,&local_4f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
        operator_delete(local_4f8._M_dataplus._M_p);
      }
      url::to_string_abi_cxx11_(&local_460,&local_658);
      local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_518,local_658.host_._M_dataplus._M_p,
                 local_658.host_._M_dataplus._M_p + local_658.host_._M_string_length);
      update_request(this,&local_460,&local_518);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._M_dataplus._M_p != &local_518.field_2) {
        operator_delete(local_518._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != &local_460.field_2) {
        operator_delete(local_460._M_dataplus._M_p);
      }
      paVar11 = &local_538.field_2;
      local_538._M_dataplus._M_p = (pointer)paVar11;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_538,local_658.host_._M_dataplus._M_p,
                 local_658.host_._M_dataplus._M_p + local_658.host_._M_string_length);
      url::port_str_abi_cxx11_(&local_480,&local_658);
      run(this,&local_538,&local_480);
      _Var10._M_p = local_538._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != &local_480.field_2) {
        operator_delete(local_480._M_dataplus._M_p);
        _Var10._M_p = local_538._M_dataplus._M_p;
      }
    }
    else {
      boost::beast::
      basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>
      ::expires_after((this->tcp_stream_).
                      super___shared_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(duration)(this->original_request_).timeout_interval.__r);
      if ((99 < (this->response_).
                super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
                result_ - multiple_choices) || ((this->original_request_).follow_location != true))
      {
        peVar3 = (((this->tcp_stream_).
                   super___shared_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->impl_).px;
        if (peVar3 == (element_type *)0x0) goto LAB_0017eba5;
        boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::shutdown
                  ((peVar3->socket).
                   super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   .impl_.service_,(int)peVar3 + 0x18,2);
        if (local_688._4_1_ == '\x01') {
          boost::system::error_condition::error_condition<boost::system::errc::errc_t>
                    ((error_condition *)&local_658,not_connected,(type *)0x0);
          iVar6 = (*peStack_680->_vptr_error_category[2])
                            (peStack_680,local_688 & 0xffffffff,&local_658);
          if (((char)iVar6 == '\0') &&
             (cVar5 = (**(code **)(*(long *)local_658.scheme_._M_string_length + 0x18))
                                (local_658.scheme_._M_string_length,&local_688,
                                 (ulong)local_658.scheme_._M_dataplus._M_p & 0xffffffff),
             cVar5 == '\0')) {
            local_4d8 = local_688;
            peStack_4d0 = peStack_680;
            std::runtime_error::runtime_error((runtime_error *)local_438,"");
            local_438[0] = &PTR__system_error_0026e108;
            local_428 = local_4d8;
            peStack_420 = peStack_4d0;
            local_418._M_p = (pointer)&local_408;
            local_410 = 0;
            local_408._M_local_buf[0] = '\0';
            result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
            ::result(&local_218,(system_error *)local_438);
            if ((this->completion_).super__Function_base._M_manager == (_Manager_type)0x0)
            goto LAB_0017ebc9;
            (*(this->completion_)._M_invoker)((_Any_data *)&this->completion_,&local_218);
            if (local_218.error.super_type.m_initialized == true) {
              boost::system::system_error::~system_error
                        ((system_error *)&local_218.error.super_type.m_storage);
              local_218.error.super_type.m_initialized = false;
            }
            boost::optional_detail::
            optional_base<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
            ::~optional_base((optional_base<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
                              *)&local_218);
            this_00 = (system_error *)local_438;
            goto LAB_0017e4f4;
          }
        }
        boost::beast::http::basic_fields<std::allocator<char>_>::basic_fields
                  ((basic_fields<std::allocator<char>_> *)&local_2c0,
                   (basic_fields<std::allocator<char>_> *)&this->response_);
        local_2c0.super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
        version_ = (this->response_).
                   super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
                   version_;
        local_2c0.super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
        result_ = (this->response_).
                  super_header<false,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
                  result_;
        boost::beast::basic_multi_buffer<std::allocator<char>_>::basic_multi_buffer
                  (&local_2c0.
                    super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
                    .value_,&(this->response_).
                             super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
                             .value_);
        local_3b8.response.super_type.m_initialized = false;
        boost::beast::http::
        message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
        ::message((message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
                   *)&local_3b8.response.super_type.m_storage,&local_2c0);
        local_3b8.response.super_type.m_initialized = true;
        local_3b8.error.super_type.m_initialized = false;
        if ((this->completion_).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(this->completion_)._M_invoker)((_Any_data *)&this->completion_,&local_3b8);
          if (local_3b8.error.super_type.m_initialized == true) {
            boost::system::system_error::~system_error
                      ((system_error *)&local_3b8.error.super_type.m_storage);
            local_3b8.error.super_type.m_initialized = false;
          }
          boost::optional_detail::
          optional_base<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
          ::~optional_base((optional_base<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
                            *)&local_3b8);
          while (local_2c0.
                 super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
                 .value_.list_.data_.root_plus_size_.m_header.super_node.next_ !=
                 &local_2c0.
                  super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
                  .value_.list_.data_.root_plus_size_.m_header.super_node) {
            plVar4 = (local_2c0.
                      super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
                      .value_.list_.data_.root_plus_size_.m_header.super_node.next_)->next_;
            operator_delete(local_2c0.
                            super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>
                            .value_.list_.data_.root_plus_size_.m_header.super_node.next_);
            local_2c0.
            super_empty_value<boost::beast::basic_multi_buffer<std::allocator<char>_>,_0U,_false>.
            value_.list_.data_.root_plus_size_.m_header.super_node.next_ = plVar4;
          }
          boost::beast::http::basic_fields<std::allocator<char>_>::~basic_fields
                    ((basic_fields<std::allocator<char>_> *)&local_2c0);
          return;
        }
        std::__throw_bad_function_call();
LAB_0017ebc9:
        uVar7 = std::__throw_bad_function_call();
        boost::system::system_error::~system_error((system_error *)local_438);
        _Unwind_Resume(uVar7);
      }
      sVar13.len_ = 8;
      sVar13.ptr_ = "Location";
      sVar13 = boost::beast::http::basic_fields<std::allocator<char>_>::operator[]
                         ((basic_fields<std::allocator<char>_> *)&this->response_,sVar13);
      local_678 = local_668;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_678,sVar13.ptr_,sVar13.ptr_ + sVar13.len_);
      local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_558,local_678,
                 (undefined1 *)((long)&p_Stack_670->_vptr__Sp_counted_base + (long)local_678));
      url::url(&local_658,&local_558);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_dataplus._M_p != &local_558.field_2) {
        operator_delete(local_558._M_dataplus._M_p);
      }
      url::to_string_abi_cxx11_(&local_4a0,&local_658);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_578,local_658.host_._M_dataplus._M_p,
                 local_658.host_._M_dataplus._M_p + local_658.host_._M_string_length);
      update_request(this,&local_4a0,&local_578);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p);
      }
      paVar11 = &local_598.field_2;
      local_598._M_dataplus._M_p = (pointer)paVar11;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_598,local_658.host_._M_dataplus._M_p,
                 local_658.host_._M_dataplus._M_p + local_658.host_._M_string_length);
      url::port_str_abi_cxx11_(&local_4c0,&local_658);
      run(this,&local_598,&local_4c0);
      _Var10._M_p = local_598._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
        operator_delete(local_4c0._M_dataplus._M_p);
        _Var10._M_p = local_598._M_dataplus._M_p;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p != paVar11) {
      operator_delete(_Var10._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_658.fragment_._M_dataplus._M_p != &local_658.fragment_.field_2) {
      operator_delete(local_658.fragment_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_658.query_._M_dataplus._M_p != &local_658.query_.field_2) {
      operator_delete(local_658.query_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_658.path_._M_dataplus._M_p != &local_658.path_.field_2) {
      operator_delete(local_658.path_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_658.port_._M_dataplus._M_p != &local_658.port_.field_2) {
      operator_delete(local_658.port_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_658.host_._M_dataplus._M_p != &local_658.host_.field_2) {
      operator_delete(local_658.host_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_658.scheme_._M_dataplus._M_p != paVar1) {
      operator_delete(local_658.scheme_._M_dataplus._M_p);
    }
    if (local_678 != local_668) {
      operator_delete(local_678);
    }
  }
  return;
}

Assistant:

void on_read(beast::error_code ec, std::size_t bytes_transferred)
		{
			boost::ignore_unused(bytes_transferred);

			if (ec) {
				completion_(savanna::result<http::response<Body>>(beast::system_error { ec }));
				return;
			}

			// Write the message to standard out
			//			std::cout << res_ << std::endl;
			if (current_scheme() == url_scheme::https) {
				// Set a timeout on the operation
				beast::get_lowest_layer(*ssl_stream_).expires_after(original_request_.timeout_interval);

				if ((response_.result_int() >= 300) && response_.result_int() < 400 && original_request_.follow_location) {
					auto location = response_.base()["Location"].to_string();
					auto new_url = savanna::url(location);
					update_request(new_url.to_string(), new_url.host());
					run(new_url.host(), new_url.port_str());
					return;
				}
				// Gracefully close the stream
				ssl_stream_->async_shutdown(
				    beast::bind_front_handler(
				        &async_request_executor::on_shutdown,
				        this->shared_from_this()));
			}
			else {
				tcp_stream_->expires_after(original_request_.timeout_interval);
				if ((response_.result_int() >= 300) && response_.result_int() < 400 && original_request_.follow_location) {
					auto location = response_.base()["Location"].to_string();
					auto new_url = savanna::url(location);
					update_request(new_url.to_string(), new_url.host());
					run(new_url.host(), new_url.port_str());
					return;
				}
				// Gracefully close the stream
				tcp_stream_->socket().shutdown(tcp::socket::shutdown_both, ec);
				if (ec && ec != beast::errc::not_connected) {
					completion_(savanna::result<http::response<Body>>(beast::system_error { ec }));
				}
				else {
					completion_(savanna::result<http::response<Body>>(std::move(response_)));
				}
			}
		}